

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregory_patch.h
# Opt level: O1

void __thiscall
embree::GregoryPatchT<embree::Vec3fa,_embree::Vec3fa>::initFaceVertex
          (GregoryPatchT<embree::Vec3fa,_embree::Vec3fa> *this,CatmullClarkPatch *irreg_patch,
          size_t index,Vec3fa *p_vtx,Vec3fa *e0_p_vtx,Vec3fa *e1_m_vtx,uint face_valence_p1,
          Vec3fa *e0_m_vtx,Vec3fa *e3_p_vtx,uint face_valence_p3,Vec3fa *f_p_vtx,Vec3fa *f_m_vtx)

{
  Vec3fa *pVVar1;
  int iVar2;
  uint uVar3;
  Vec3fa *pVVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  uint uVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  
  iVar2 = (irreg_patch->ring).items[index].border_index;
  uVar3 = (irreg_patch->ring).items[index].face_valence;
  pVVar4 = (irreg_patch->ring).items[index].ring.data;
  pVVar1 = &(irreg_patch->ring).items[index].vtx;
  fVar27 = (pVVar1->field_0).m128[0];
  fVar28 = (pVVar1->field_0).m128[1];
  fVar29 = (pVVar1->field_0).m128[2];
  fVar30 = (pVVar1->field_0).m128[3];
  fVar40 = (pVVar4->field_0).m128[0] + fVar27;
  fVar41 = (pVVar4->field_0).m128[1] + fVar28;
  fVar42 = (pVVar4->field_0).m128[2] + fVar29;
  fVar43 = (pVVar4->field_0).m128[3] + fVar30;
  uVar15 = uVar3 - 1;
  pVVar1 = pVVar4 + (ulong)(uVar15 != 0) * 2;
  fVar35 = pVVar4[2].field_0.m128[0] + fVar27;
  fVar37 = pVVar4[2].field_0.m128[1] + fVar28;
  fVar38 = pVVar4[2].field_0.m128[2] + fVar29;
  fVar39 = pVVar4[2].field_0.m128[3] + fVar30;
  fVar14 = ABS((irreg_patch->ring).items[index].vertex_crease_weight);
  if (fVar14 == INFINITY) {
    bVar16 = ABS(*(irreg_patch->ring).items[index].crease_weight.data) == INFINITY;
  }
  else {
    bVar16 = false;
  }
  fVar44 = (pVVar4[1].field_0.m128[0] + fVar40 + (pVVar1->field_0).m128[0]) * 0.25;
  fVar45 = (pVVar4[1].field_0.m128[1] + fVar41 + (pVVar1->field_0).m128[1]) * 0.25;
  fVar46 = (pVVar4[1].field_0.m128[2] + fVar42 + (pVVar1->field_0).m128[2]) * 0.25;
  fVar47 = (pVVar4[1].field_0.m128[3] + fVar43 + (pVVar1->field_0).m128[3]) * 0.25;
  fVar40 = fVar40 * 0.5;
  fVar41 = fVar41 * 0.5;
  fVar42 = fVar42 * 0.5;
  fVar43 = fVar43 * 0.5;
  fVar31 = fVar35 * 0.5;
  fVar32 = fVar37 * 0.5;
  fVar33 = fVar38 * 0.5;
  fVar34 = fVar39 * 0.5;
  if ((iVar2 == (irreg_patch->ring).items[index].edge_valence - 2) || (bVar16)) {
    fVar23 = (fVar40 - fVar44) + (fVar40 - fVar44) + fVar44;
    fVar24 = (fVar41 - fVar45) + (fVar41 - fVar45) + fVar45;
    fVar25 = (fVar42 - fVar46) + (fVar42 - fVar46) + fVar46;
    fVar26 = (fVar43 - fVar47) + (fVar43 - fVar47) + fVar47;
    fVar19 = (fVar27 - fVar31) + (fVar27 - fVar31) + fVar31;
    fVar20 = (fVar28 - fVar32) + (fVar28 - fVar32) + fVar32;
    fVar21 = (fVar29 - fVar33) + (fVar29 - fVar33) + fVar33;
    fVar22 = (fVar30 - fVar34) + (fVar30 - fVar34) + fVar34;
  }
  else {
    pVVar1 = pVVar4 + (ulong)uVar15 * 2;
    fVar19 = (pVVar1->field_0).m128[0] + fVar27;
    fVar20 = (pVVar1->field_0).m128[1] + fVar28;
    fVar21 = (pVVar1->field_0).m128[2] + fVar29;
    fVar22 = (pVVar1->field_0).m128[3] + fVar30;
    pVVar1 = pVVar4 + (ulong)uVar15 * 2 + 1;
    fVar23 = ((pVVar1->field_0).m128[0] + fVar19 + (pVVar4->field_0).m128[0]) * 0.25;
    fVar24 = ((pVVar1->field_0).m128[1] + fVar20 + (pVVar4->field_0).m128[1]) * 0.25;
    fVar25 = ((pVVar1->field_0).m128[2] + fVar21 + (pVVar4->field_0).m128[2]) * 0.25;
    fVar26 = ((pVVar1->field_0).m128[3] + fVar22 + (pVVar4->field_0).m128[3]) * 0.25;
    fVar19 = fVar19 * 0.5;
    fVar20 = fVar20 * 0.5;
    fVar21 = fVar21 * 0.5;
    fVar22 = fVar22 * 0.5;
  }
  if (fVar14 == INFINITY) {
    bVar16 = ABS((irreg_patch->ring).items[index].crease_weight.data[1]) == INFINITY;
  }
  else {
    bVar16 = false;
  }
  if ((iVar2 == 2) || (bVar16)) {
    fVar14 = (fVar31 - fVar44) + (fVar31 - fVar44) + fVar44;
    fVar35 = (fVar32 - fVar45) + (fVar32 - fVar45) + fVar45;
    fVar37 = (fVar33 - fVar46) + (fVar33 - fVar46) + fVar46;
    fVar38 = (fVar34 - fVar47) + (fVar34 - fVar47) + fVar47;
    fVar27 = (fVar27 - fVar40) + (fVar27 - fVar40) + fVar40;
    fVar28 = (fVar28 - fVar41) + (fVar28 - fVar41) + fVar41;
    fVar29 = (fVar29 - fVar42) + (fVar29 - fVar42) + fVar42;
    fVar30 = (fVar30 - fVar43) + (fVar30 - fVar43) + fVar43;
  }
  else {
    pVVar1 = pVVar4 + (ulong)(uVar15 != 1) * 4;
    fVar14 = (fVar35 + pVVar4[3].field_0.m128[0] + (pVVar1->field_0).m128[0]) * 0.25;
    fVar35 = (fVar37 + pVVar4[3].field_0.m128[1] + (pVVar1->field_0).m128[1]) * 0.25;
    fVar37 = (fVar38 + pVVar4[3].field_0.m128[2] + (pVVar1->field_0).m128[2]) * 0.25;
    fVar38 = (fVar39 + pVVar4[3].field_0.m128[3] + (pVVar1->field_0).m128[3]) * 0.25;
    fVar27 = (fVar27 + pVVar4[4].field_0.m128[0]) * 0.5;
    fVar28 = (fVar28 + pVVar4[4].field_0.m128[1]) * 0.5;
    fVar29 = (fVar29 + pVVar4[4].field_0.m128[2]) * 0.5;
    fVar30 = (fVar30 + pVVar4[4].field_0.m128[3]) * 0.5;
  }
  if (uVar3 < 0x41) {
    fVar39 = *(float *)(CatmullClarkPrecomputedCoefficients::table + (ulong)uVar3 * 4);
  }
  else {
    fVar39 = cosf(6.2831855 / (float)uVar3);
  }
  if (face_valence_p1 < 0x41) {
    fVar17 = *(float *)(CatmullClarkPrecomputedCoefficients::table + (ulong)face_valence_p1 * 4);
  }
  else {
    fVar17 = cosf(6.2831855 / (float)face_valence_p1);
  }
  if (face_valence_p3 < 0x41) {
    fVar18 = *(float *)(CatmullClarkPrecomputedCoefficients::table + (ulong)face_valence_p3 * 4);
  }
  else {
    fVar18 = cosf(6.2831855 / (float)face_valence_p3);
  }
  fVar5 = (p_vtx->field_0).m128[1];
  fVar6 = (p_vtx->field_0).m128[2];
  fVar7 = (p_vtx->field_0).m128[3];
  fVar39 = fVar39 + fVar39;
  fVar36 = (3.0 - fVar39) - fVar17;
  fVar8 = (e0_p_vtx->field_0).m128[1];
  fVar9 = (e0_p_vtx->field_0).m128[2];
  fVar10 = (e0_p_vtx->field_0).m128[3];
  fVar11 = (e1_m_vtx->field_0).m128[1];
  fVar12 = (e1_m_vtx->field_0).m128[2];
  fVar13 = (e1_m_vtx->field_0).m128[3];
  (f_p_vtx->field_0).m128[0] =
       ((e1_m_vtx->field_0).m128[0] * fVar39 +
        fVar36 * (e0_p_vtx->field_0).m128[0] + fVar17 * (p_vtx->field_0).m128[0] +
       (fVar44 - fVar23) * 0.6666667 + (fVar31 - fVar19) * 0.33333334) * 0.33333334;
  (f_p_vtx->field_0).m128[1] =
       (fVar11 * fVar39 + fVar36 * fVar8 + fVar17 * fVar5 +
       (fVar45 - fVar24) * 0.6666667 + (fVar32 - fVar20) * 0.33333334) * 0.33333334;
  (f_p_vtx->field_0).m128[2] =
       (fVar12 * fVar39 + fVar36 * fVar9 + fVar17 * fVar6 +
       (fVar46 - fVar25) * 0.6666667 + (fVar33 - fVar21) * 0.33333334) * 0.33333334;
  (f_p_vtx->field_0).m128[3] =
       (fVar13 * fVar39 + fVar36 * fVar10 + fVar17 * fVar7 +
       (fVar47 - fVar26) * 0.6666667 + (fVar34 - fVar22) * 0.33333334) * 0.33333334;
  fVar24 = (3.0 - fVar39) - fVar18;
  fVar31 = (p_vtx->field_0).m128[1];
  fVar32 = (p_vtx->field_0).m128[2];
  fVar33 = (p_vtx->field_0).m128[3];
  fVar34 = (e0_m_vtx->field_0).m128[1];
  fVar19 = (e0_m_vtx->field_0).m128[2];
  fVar20 = (e0_m_vtx->field_0).m128[3];
  fVar21 = (e3_p_vtx->field_0).m128[1];
  fVar22 = (e3_p_vtx->field_0).m128[2];
  fVar23 = (e3_p_vtx->field_0).m128[3];
  (f_m_vtx->field_0).m128[0] =
       (fVar39 * (e3_p_vtx->field_0).m128[0] +
        fVar24 * (e0_m_vtx->field_0).m128[0] + fVar18 * (p_vtx->field_0).m128[0] +
       (fVar44 - fVar14) * 0.6666667 + (fVar40 - fVar27) * 0.33333334) * 0.33333334;
  (f_m_vtx->field_0).m128[1] =
       (fVar39 * fVar21 + fVar24 * fVar34 + fVar18 * fVar31 +
       (fVar45 - fVar35) * 0.6666667 + (fVar41 - fVar28) * 0.33333334) * 0.33333334;
  (f_m_vtx->field_0).m128[2] =
       (fVar39 * fVar22 + fVar24 * fVar19 + fVar18 * fVar32 +
       (fVar46 - fVar37) * 0.6666667 + (fVar42 - fVar29) * 0.33333334) * 0.33333334;
  (f_m_vtx->field_0).m128[3] =
       (fVar39 * fVar23 + fVar24 * fVar20 + fVar18 * fVar33 +
       (fVar47 - fVar38) * 0.6666667 + (fVar43 - fVar30) * 0.33333334) * 0.33333334;
  return;
}

Assistant:

void initFaceVertex(const CatmullClarkPatch& irreg_patch, 
			const size_t index, 
			const Vertex& p_vtx, 
                        const Vertex& e0_p_vtx, 
			const Vertex& e1_m_vtx, 
			const unsigned int face_valence_p1,
 			const Vertex& e0_m_vtx,	
			const Vertex& e3_p_vtx,	
			const unsigned int face_valence_p3,
			Vertex& f_p_vtx, 
			Vertex& f_m_vtx)
    {
      const unsigned int face_valence = irreg_patch.ring[index].face_valence;
      const unsigned int edge_valence = irreg_patch.ring[index].edge_valence;
      const unsigned int border_index = irreg_patch.ring[index].border_index;
      
      const Vertex& vtx     = irreg_patch.ring[index].vtx;
      const Vertex e_i      = irreg_patch.ring[index].getEdgeCenter(0);
      const Vertex c_i_m_1  = irreg_patch.ring[index].getQuadCenter(0);
      const Vertex e_i_m_1  = irreg_patch.ring[index].getEdgeCenter(1);
      
      Vertex c_i, e_i_p_1;
      const bool hasHardEdge0 =
        std::isinf(irreg_patch.ring[index].vertex_crease_weight) &&
        std::isinf(irreg_patch.ring[index].crease_weight[0]);
                
      if (unlikely((border_index == edge_valence-2) || hasHardEdge0))
      {
        /* mirror quad center and edge mid-point */
        c_i     = madd(2.0f, e_i - c_i_m_1, c_i_m_1);
        e_i_p_1 = madd(2.0f, vtx - e_i_m_1, e_i_m_1);
      }
      else
      {
        c_i     = irreg_patch.ring[index].getQuadCenter( face_valence-1 );
        e_i_p_1 = irreg_patch.ring[index].getEdgeCenter( face_valence-1 );
      }
      
      Vertex c_i_m_2, e_i_m_2;
      const bool hasHardEdge1 =
        std::isinf(irreg_patch.ring[index].vertex_crease_weight) &&
        std::isinf(irreg_patch.ring[index].crease_weight[1]);
      
      if (unlikely(border_index == 2 || hasHardEdge1))
      {
        /* mirror quad center and edge mid-point */
        c_i_m_2  = madd(2.0f, e_i_m_1 - c_i_m_1, c_i_m_1);
        e_i_m_2  = madd(2.0f, vtx - e_i, + e_i);
      }
      else
      {
        c_i_m_2  = irreg_patch.ring[index].getQuadCenter( 1 );
        e_i_m_2  = irreg_patch.ring[index].getEdgeCenter( 2 );
      }      
      
      const float d = 3.0f;
      //const float c     = cosf(2.0f*M_PI/(float)face_valence);
      //const float c_e_p = cosf(2.0f*M_PI/(float)face_valence_p1);
      //const float c_e_m = cosf(2.0f*M_PI/(float)face_valence_p3);
      
      const float c     = CatmullClarkPrecomputedCoefficients::table.cos_2PI_div_n(face_valence);
      const float c_e_p = CatmullClarkPrecomputedCoefficients::table.cos_2PI_div_n(face_valence_p1);
      const float c_e_m = CatmullClarkPrecomputedCoefficients::table.cos_2PI_div_n(face_valence_p3);

      const Vertex r_e_p = 1.0f/3.0f * (e_i_m_1 - e_i_p_1) + 2.0f/3.0f * (c_i_m_1 - c_i);
      const Vertex r_e_m = 1.0f/3.0f * (e_i     - e_i_m_2) + 2.0f/3.0f * (c_i_m_1 - c_i_m_2);

      f_p_vtx = 1.0f / d * (c_e_p * p_vtx + (d - 2.0f*c - c_e_p) * e0_p_vtx + 2.0f*c* e1_m_vtx + r_e_p);      
      f_m_vtx = 1.0f / d * (c_e_m * p_vtx + (d - 2.0f*c - c_e_m) * e0_m_vtx + 2.0f*c* e3_p_vtx + r_e_m);     
    }